

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

S2Cap * __thiscall S2Cap::Complement(S2Cap *__return_storage_ptr__,S2Cap *this)

{
  bool bVar1;
  double dVar2;
  S1ChordAngle radius;
  D local_30;
  S2Cap *local_18;
  S2Cap *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = is_full(this);
  if (bVar1) {
    Empty();
  }
  else {
    bVar1 = is_empty(this);
    if (bVar1) {
      Full();
    }
    else {
      util::math::internal_vector::operator-(&local_30,&this->center_);
      dVar2 = S1ChordAngle::length2(&this->radius_);
      radius = S1ChordAngle::FromLength2(4.0 - dVar2);
      S2Cap(__return_storage_ptr__,&local_30,radius);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Complement() const {
  // The complement of a full cap is an empty cap, not a singleton.
  // Also make sure that the complement of an empty cap is full.
  if (is_full()) return Empty();
  if (is_empty()) return Full();
  return S2Cap(-center_, S1ChordAngle::FromLength2(4 - radius_.length2()));
}